

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopOper.c
# Opt level: O2

Hop_Obj_t * Hop_Maj(Hop_Man_t *p,Hop_Obj_t *pA,Hop_Obj_t *pB,Hop_Obj_t *pC)

{
  Hop_Obj_t *pHVar1;
  Hop_Obj_t *pHVar2;
  
  pHVar1 = Hop_And(p,pA,pB);
  pHVar2 = Hop_And(p,pA,pC);
  pHVar1 = Hop_Or(p,pHVar1,pHVar2);
  pHVar2 = Hop_And(p,pB,pC);
  pHVar1 = Hop_Or(p,pHVar1,pHVar2);
  return pHVar1;
}

Assistant:

Hop_Obj_t * Hop_Maj( Hop_Man_t * p, Hop_Obj_t * pA, Hop_Obj_t * pB, Hop_Obj_t * pC )
{
    return Hop_Or( p, Hop_Or(p, Hop_And(p, pA, pB), Hop_And(p, pA, pC)), Hop_And(p, pB, pC) );
}